

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O2

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::reset(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this
       ,size_t width,size_t size)

{
  word_type wVar1;
  
  if (this->_width != width) {
    this->_width = width;
    wVar1 = compute_field_mask(width);
    this->_field_mask = wVar1;
  }
  resize(this,size);
  return;
}

Assistant:

void reset(size_t width, size_t size) {
                assert(size == 0 || width != 0);
                
                if(width != _width) {
                    _width = width;
                    _field_mask = compute_field_mask(width);
                }
                resize(size);
            }